

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstructCondense.cpp
# Opt level: O1

void __thiscall
TPZDohrSubstructCondense<double>::ContributeKULocal
          (TPZDohrSubstructCondense<double> *this,double alpha,TPZFMatrix<double> *u,
          TPZFMatrix<double> *z)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  TPZMatRed<double,_TPZFMatrix<double>_> *pTVar3;
  const_iterator cVar4;
  const_iterator cVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  Numbering relat2;
  TPZFMatrix<double> resloc;
  Numbering relat;
  TPZFMatrix<double> resglobal;
  TPZFMatrix<double> resborder;
  TPZFMatrix<double> uborder;
  TPZFMatrix<double> uloc;
  key_type local_310;
  TPZFMatrix<double> local_308;
  key_type local_278;
  TPZFMatrix<double> local_270;
  TPZFMatrix<double> local_1e0;
  TPZFMatrix<double> local_150;
  TPZFMatrix<double> local_c0;
  
  lVar13 = (long)this->fNEquations;
  lVar7 = (long)(int)(u->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
  uVar6 = this->fNEquations - this->fNumInternalEquations;
  local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0183c898;
  local_c0.fElem = (double *)0x0;
  local_c0.fGiven = (double *)0x0;
  local_c0.fSize = 0;
  local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = lVar13;
  local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar7;
  TPZVec<int>::TPZVec(&local_c0.fPivot.super_TPZVec<int>,0);
  local_c0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_c0.fPivot.super_TPZVec<int>.fStore = local_c0.fPivot.fExtAlloc;
  local_c0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_c0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_c0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_c0.fWork.fStore = (double *)0x0;
  local_c0.fWork.fNElements = 0;
  local_c0.fWork.fNAlloc = 0;
  uVar8 = lVar7 * lVar13;
  if (uVar8 != 0) {
    uVar12 = 0xffffffffffffffff;
    if (uVar8 < 0x2000000000000000) {
      uVar12 = uVar8 * 8;
    }
    local_c0.fElem = (double *)operator_new__(uVar12);
    if (0 < (long)uVar8) {
      memset(local_c0.fElem,0,uVar8 * 8);
    }
  }
  lVar11 = (long)(this->fNEquations - this->fNumInternalEquations);
  local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0183c898;
  local_150.fElem = (double *)0x0;
  local_150.fGiven = (double *)0x0;
  local_150.fSize = 0;
  local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = lVar11;
  local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar7;
  TPZVec<int>::TPZVec(&local_150.fPivot.super_TPZVec<int>,0);
  local_150.fPivot.super_TPZVec<int>.fStore = local_150.fPivot.fExtAlloc;
  local_150.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_150.fPivot.super_TPZVec<int>.fNElements = 0;
  local_150.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_150.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_150.fWork.fStore = (double *)0x0;
  local_150.fWork.fNElements = 0;
  local_150.fWork.fNAlloc = 0;
  uVar12 = lVar11 * lVar7;
  if (uVar12 != 0) {
    uVar9 = 0xffffffffffffffff;
    if (uVar12 < 0x2000000000000000) {
      uVar9 = uVar12 * 8;
    }
    local_150.fElem = (double *)operator_new__(uVar9);
    if (0 < (long)uVar12) {
      memset(local_150.fElem,0,uVar12 * 8);
    }
  }
  lVar11 = (long)(this->fNEquations - this->fNumInternalEquations);
  local_1e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_1e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_1e0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0183c898;
  local_1e0.fElem = (double *)0x0;
  local_1e0.fGiven = (double *)0x0;
  local_1e0.fSize = 0;
  local_1e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = lVar11;
  local_1e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar7;
  TPZVec<int>::TPZVec(&local_1e0.fPivot.super_TPZVec<int>,0);
  local_1e0.fPivot.super_TPZVec<int>.fStore = local_1e0.fPivot.fExtAlloc;
  local_1e0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_1e0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_1e0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_1e0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_1e0.fWork.fStore = (double *)0x0;
  local_1e0.fWork.fNElements = 0;
  local_1e0.fWork.fNAlloc = 0;
  uVar12 = lVar11 * lVar7;
  if (uVar12 != 0) {
    uVar9 = 0xffffffffffffffff;
    if (uVar12 < 0x2000000000000000) {
      uVar9 = uVar12 * 8;
    }
    local_1e0.fElem = (double *)operator_new__(uVar9);
    if (0 < (long)uVar12) {
      memset(local_1e0.fElem,0,uVar12 * 8);
    }
  }
  local_278.first = ExternalFirst;
  local_278.second = Submesh;
  local_310.first = InternalFirst;
  local_310.second = Submesh;
  cVar4 = std::
          _Rb_tree<std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_std::pair<const_std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>_>,_std::_Select1st<std::pair<const_std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>_>_>,_std::less<std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>_>,_std::allocator<std::pair<const_std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>_>_>_>
          ::find(&(this->fPermutationsScatter)._M_t,&local_278);
  cVar5 = std::
          _Rb_tree<std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_std::pair<const_std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>_>,_std::_Select1st<std::pair<const_std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>_>_>,_std::less<std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>_>,_std::allocator<std::pair<const_std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>_>_>_>
          ::find(&(this->fPermutationsScatter)._M_t,&local_310);
  p_Var1 = &(this->fPermutationsScatter)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar5._M_node != p_Var1 && (_Rb_tree_header *)cVar4._M_node != p_Var1) {
    PermuteScatter((TPZVec<int> *)&cVar4._M_node[1]._M_parent,u,&local_c0,0,
                   (int)(u->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow);
    PermuteGather((TPZVec<int> *)&cVar5._M_node[1]._M_parent,&local_c0,&local_150,
                  this->fNumInternalEquations,this->fNEquations);
    pTVar3 = ((this->fMatRed).fRef)->fPointer;
    (*(pTVar3->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x25])
              (pTVar3,&local_150,&local_1e0,0);
    local_270.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_270.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_270.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_0183c898;
    local_270.fElem = (double *)0x0;
    local_270.fGiven = (double *)0x0;
    local_270.fSize = 0;
    local_270.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = lVar13;
    local_270.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar7;
    TPZVec<int>::TPZVec(&local_270.fPivot.super_TPZVec<int>,0);
    local_270.fPivot.super_TPZVec<int>.fStore = local_270.fPivot.fExtAlloc;
    local_270.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
    local_270.fPivot.super_TPZVec<int>.fNElements = 0;
    local_270.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_270.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
    local_270.fWork.fStore = (double *)0x0;
    local_270.fWork.fNElements = 0;
    local_270.fWork.fNAlloc = 0;
    if (uVar8 != 0) {
      uVar12 = 0xffffffffffffffff;
      if (uVar8 < 0x2000000000000000) {
        uVar12 = uVar8 * 8;
      }
      local_270.fElem = (double *)operator_new__(uVar12);
      if (0 < (long)uVar8) {
        memset(local_270.fElem,0,uVar8 * 8);
      }
    }
    iVar2 = this->fNumExternalEquations;
    local_308.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_308.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_308.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_0183c898;
    local_308.fElem = (double *)0x0;
    local_308.fGiven = (double *)0x0;
    local_308.fSize = 0;
    local_308.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = (long)iVar2;
    local_308.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar7;
    TPZVec<int>::TPZVec(&local_308.fPivot.super_TPZVec<int>,0);
    local_308.fPivot.super_TPZVec<int>.fStore = local_308.fPivot.fExtAlloc;
    local_308.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
    local_308.fPivot.super_TPZVec<int>.fNElements = 0;
    local_308.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_308.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
    local_308.fWork.fStore = (double *)0x0;
    local_308.fWork.fNElements = 0;
    local_308.fWork.fNAlloc = 0;
    uVar8 = lVar7 * iVar2;
    if (uVar8 != 0) {
      uVar12 = 0xffffffffffffffff;
      if (uVar8 < 0x2000000000000000) {
        uVar12 = uVar8 * 8;
      }
      local_308.fElem = (double *)operator_new__(uVar12);
      if (0 < (long)uVar8) {
        memset(local_308.fElem,0,uVar8 * 8);
      }
    }
    PermuteScatter((TPZVec<int> *)&cVar5._M_node[1]._M_parent,&local_1e0,&local_270,
                   this->fNumInternalEquations,this->fNEquations);
    PermuteGather((TPZVec<int> *)&cVar4._M_node[1]._M_parent,&local_270,&local_308,0,
                  (int)(u->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow);
    if (0 < (int)uVar6) {
      uVar10 = (uint)(z->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
      uVar8 = 0;
      do {
        if (0 < (int)uVar10) {
          uVar12 = 0;
          do {
            if ((local_308.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar8) ||
               (local_308.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= (long)uVar12)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if (((z->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= (long)uVar8) ||
               ((z->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= (long)uVar12)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            lVar7 = (z->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * uVar12;
            z->fElem[lVar7 + uVar8] =
                 local_308.fElem
                 [local_308.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * uVar12 + uVar8] *
                 alpha + z->fElem[lVar7 + uVar8];
            uVar12 = uVar12 + 1;
          } while ((uVar10 & 0x7fffffff) != uVar12);
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 != uVar6);
    }
    TPZFMatrix<double>::~TPZFMatrix(&local_308);
    TPZFMatrix<double>::~TPZFMatrix(&local_270);
  }
  TPZFMatrix<double>::~TPZFMatrix(&local_1e0);
  TPZFMatrix<double>::~TPZFMatrix(&local_150);
  TPZFMatrix<double>::~TPZFMatrix(&local_c0);
  return;
}

Assistant:

void TPZDohrSubstructCondense<TVar>::ContributeKULocal(const TVar alpha, const TPZFMatrix<TVar> &u, TPZFMatrix<TVar> &z) const
{
	int i,j;
	int nglob = fNEquations;
	int ncols = u.Cols();
	int neqs = fNEquations-fNumInternalEquations;
	TPZFMatrix<TVar> uloc(nglob,ncols,0.), uborder(fNEquations-fNumInternalEquations,ncols,0.),resborder(fNEquations-fNumInternalEquations,ncols,0.);
	typedef std::pair<ENumbering,ENumbering> Numbering;
	Numbering relat(ExternalFirst,Submesh);
	Numbering relat2(InternalFirst,Submesh);
	typename std::map<std::pair<ENumbering, ENumbering> , TPZVec<int> >::const_iterator itrelat, itrelat2;
	itrelat = fPermutationsScatter.find(relat);
	itrelat2 = fPermutationsScatter.find(relat2);
	if(itrelat == fPermutationsScatter.end() || itrelat2 == fPermutationsScatter.end())
	{
		return;
	}
#ifdef PZ_LOG
	if(logger.isDebugEnabled())
	{
		std::stringstream sout;
		sout << "Scatter from external do submesh" << itrelat->second << std::endl;
		sout << "Scatter from submesh to internal" << itrelat2->second << std::endl;
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
	PermuteScatter(itrelat->second, u, uloc, 0, u.Rows());
	PermuteGather(itrelat2->second, uloc, uborder, fNumInternalEquations, fNEquations);
#ifdef PZ_LOG
	if(logger.isDebugEnabled())
	{
		std::stringstream sout;
		u.Print("Input matrix ", sout);
		uloc.Print("Natural ordering matrix",sout);
		uborder.Print("Matrix passed to the matred object", sout);
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
	fMatRed->Multiply(uborder,resborder);
	
	TPZFMatrix<TVar> resglobal(nglob,ncols,0.),resloc(fNumExternalEquations,ncols,0.);
	PermuteScatter(itrelat2->second, resborder, resglobal, fNumInternalEquations, fNEquations);
	PermuteGather(itrelat->second, resglobal, resloc, 0, u.Rows());
#ifdef PZ_LOG
	{
		std::stringstream sout;
		sout << "Value of the local multiply = ";
		resborder.Print("resborder " ,sout);
		resglobal.Print("resglobal ",sout);
		resloc.Print("resloc ",sout);
		if (logger.isDebugEnabled())
		{
			LOGPZ_DEBUG(logger, sout.str());
		}
	}
#endif
	int zcols = z.Cols();
	for (i=0;i<neqs;i++) {
		/* Sum row "i" of temp1 with row "fGlobalNodes[i]" of z */
		for (j=0;j<zcols;j++) {
			z(i,j) += alpha*resloc(i,j);
		}
	}
}